

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
unitStrings_electronVolt_Test::unitStrings_electronVolt_Test(unitStrings_electronVolt_Test *this)

{
  unitStrings_electronVolt_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__unitStrings_electronVolt_Test_002f9088;
  return;
}

Assistant:

TEST(unitStrings, electronVolt)
{
    EXPECT_EQ(to_string(precise::energy::eV), "eV");
    EXPECT_EQ(to_string(precise::nano * precise::energy::eV), "neV");
    EXPECT_EQ(to_string(precise::micro * precise::energy::eV), "ueV");
    EXPECT_EQ(to_string(precise::milli * precise::energy::eV), "meV");
    EXPECT_EQ(to_string(precise::kilo * precise::energy::eV), "keV");
    EXPECT_EQ(to_string(precise::mega * precise::energy::eV), "MeV");
    EXPECT_EQ(to_string(precise::giga * precise::energy::eV), "GeV");
    EXPECT_EQ(to_string(precise::tera * precise::energy::eV), "TeV");

    auto str =
        to_string(precise::count / (precise::milli * precise::energy::eV));
    EXPECT_EQ(str, "count/meV");

    str = to_string(precise::one / (precise::micro * precise::energy::eV));
    EXPECT_EQ(str, "1/ueV");

    str = to_string(precise::m / precise::energy::eV);
    EXPECT_EQ(str, "m/eV");
}